

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::BeginLoopIfCharInst::Exec
          (BeginLoopIfCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  int iVar2;
  uint uVar3;
  LoopInfo *pLVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  int iVar8;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    iVar2 = (this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId;
    if (((long)iVar2 < 0) || (((matcher->program).ptr)->numLoops <= iVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                         "loopId >= 0 && loopId < program->numLoops");
      if (!bVar6) {
LAB_00f0b927:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar7 = 0;
    }
    pLVar4 = (matcher->loopInfos).ptr;
    iVar8 = (this->super_BodyGroupsMixin).minBodyGroupId;
    if (iVar8 <= (this->super_BodyGroupsMixin).maxBodyGroupId) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if ((iVar8 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar8)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                             "groupId >= 0 && groupId < program->numGroups");
          if (!bVar6) goto LAB_00f0b927;
          *puVar7 = 0;
        }
        if ((matcher->groupInfos).ptr[iVar8].length != 0xffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0xbf5,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                             "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
          if (!bVar6) goto LAB_00f0b927;
          *puVar7 = 0;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 <= (this->super_BodyGroupsMixin).maxBodyGroupId);
    }
    pLVar4[iVar2].number = 0;
    *instPointer = *instPointer + 0x1d;
  }
  else {
    if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower != 0) {
      bVar6 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
      return bVar6;
    }
    uVar3 = (this->super_BeginLoopMixin).exitLabel;
    if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (!bVar6) goto LAB_00f0b927;
      *puVar7 = 0;
    }
    *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar3;
  }
  return false;
}

Assistant:

inline bool BeginLoopIfCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            // Commit to at least one iteration of loop
            LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

            // All inner groups must begin reset
#if DBG
            for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
            {
                Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
            }
#endif
            loopInfo->number = 0;
            instPointer += sizeof(*this);
            return false;
        }

        if (repeats.lower > 0)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer = matcher.LabelToInstPointer(exitLabel);
        return false;
    }